

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

bool __thiscall
LZ77Compressor::search
          (LZ77Compressor *this,uint8_t *bytes,int srcOffset,int maxLen,int *matchOff,int *matchLen)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int off2;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = (ulong)bytes[(long)srcOffset + 2] << 2 ^
          (ulong)((uint)bytes[(long)srcOffset + 1] * 2) ^ (ulong)bytes[srcOffset];
  *matchOff = -1;
  *matchLen = 2;
  piVar6 = this->dict[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = this->dict[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = 0;
  if (0 < maxLen) {
    uVar5 = (ulong)(uint)maxLen;
  }
  iVar2 = 2;
  for (; iVar3 = iVar2, piVar6 != piVar1; piVar6 = piVar6 + 1) {
    iVar3 = *piVar6;
    if (srcOffset < iVar3 + maxLen) {
      iVar4 = iVar3;
      for (uVar7 = 0; uVar8 = uVar5, uVar5 != uVar7; uVar7 = uVar7 + 1) {
        if (srcOffset <= iVar4) {
          iVar4 = iVar3;
        }
        uVar8 = uVar7;
        if (bytes[iVar4] != bytes[uVar7 + (long)srcOffset]) break;
        iVar4 = iVar4 + 1;
      }
    }
    else {
      for (uVar7 = 0;
          (uVar8 = uVar5, uVar5 != uVar7 &&
          (uVar8 = uVar7, bytes[uVar7 + (long)iVar3] == bytes[uVar7 + (long)srcOffset]));
          uVar7 = uVar7 + 1) {
      }
    }
    iVar4 = (int)uVar8;
    if (iVar2 < iVar4) {
      *matchOff = iVar3;
      *matchLen = iVar4;
      iVar3 = maxLen;
      iVar2 = iVar4;
      if (iVar4 == maxLen) break;
    }
  }
  return 2 < iVar3;
}

Assistant:

bool search(const uint8_t* bytes, int srcOffset, int maxLen, int& matchOff, int& matchLen) {
		auto& v = dict[hash(bytes + srcOffset)];

		matchOff = -1;
		matchLen = 2;

		for (int off : v) {
			int i = 0;
			if (off + maxLen > srcOffset) {
				// Unlikely, will wrap
				for (int off2 = off; i < maxLen; i++, off2++) {
					if (off2 >= srcOffset) {
						off2 = off;
					}
					if (bytes[off2] != bytes[srcOffset + i]) { break; }
				}
			} else {
				for (; i < maxLen; i++) {
					if (bytes[off + i] != bytes[srcOffset + i]) { break; }
				}
			}
			if (i > matchLen) {
				matchOff = off;
				matchLen = i;
				if (matchLen == maxLen) { break; }
			}
		}

		return matchLen > 2;
	}